

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::NegativeCompileTime::Run(NegativeCompileTime *this)

{
  bool bVar1;
  long lVar2;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "#version 420 core\nlayout(location = 0) out vec4 g_color;\nlayout(binding = 0, rg16f) uniform image2D g_image;\nuniform ivec2 g_expected_size;\nvoid main() {\n  if (imageSize(g_image) == g_expected_size) g_color = vec4(0, 1, 0, 1);\n  else g_color = vec4(1, 0, 0, 1);\n}"
             ,&local_31);
  bVar1 = Compile(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "#version 430 core\nlayout(location = 0) out vec4 g_color;\nlayout(binding = 0) uniform sampler2D g_sampler;\nuniform ivec2 g_expected_size;\nvoid main() {\n  if (imageSize(g_sampler) == g_expected_size) g_color = vec4(0, 1, 0, 1);\n  else g_color = vec4(1, 0, 0, 1);\n}"
               ,&local_31);
    bVar1 = Compile(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    lVar2 = (ulong)bVar1 - 1;
  }
  else {
    lVar2 = -1;
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{
		// '#extension GL_ARB_shader_image_size : require' is missing
		if (!Compile("#version 420 core" NL "layout(location = 0) out vec4 g_color;" NL
					 "layout(binding = 0, rg16f) uniform image2D g_image;" NL "uniform ivec2 g_expected_size;" NL
					 "void main() {" NL "  if (imageSize(g_image) == g_expected_size) g_color = vec4(0, 1, 0, 1);" NL
					 "  else g_color = vec4(1, 0, 0, 1);" NL "}"))
			return ERROR;
		// imageSize(sampler)
		if (!Compile("#version 430 core" NL "layout(location = 0) out vec4 g_color;" NL
					 "layout(binding = 0) uniform sampler2D g_sampler;" NL "uniform ivec2 g_expected_size;" NL
					 "void main() {" NL "  if (imageSize(g_sampler) == g_expected_size) g_color = vec4(0, 1, 0, 1);" NL
					 "  else g_color = vec4(1, 0, 0, 1);" NL "}"))
			return ERROR;
		return NO_ERROR;
	}